

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *samplings;
  _Rb_tree_node_base *p_Var1;
  ostringstream *poVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  int iVar6;
  MessageBuilder *this_01;
  _Rb_tree_node_base *p_Var7;
  IVal *pIVar8;
  IVal *value;
  IVal *ival;
  size_t sVar9;
  long lVar10;
  TestStatus *__return_storage_ptr___00;
  string *this_02;
  bool bVar11;
  IVal reference1;
  int numErrors;
  FuncSet funcs;
  IVal in2;
  Environment env;
  FloatFormat highpFmt;
  void *outputArr [2];
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  IVal in3;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal reference0;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffab8;
  IVal local_541;
  TestLog *local_540;
  ulong local_538;
  FloatFormat *local_530;
  uint local_524;
  undefined1 local_520 [32];
  _Rb_tree_node_base *local_500;
  double local_4f8;
  size_t local_4f0;
  long local_4e8;
  string local_4e0;
  TestStatus *local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4b8;
  FloatFormat local_488;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  pointer local_438;
  pointer local_430;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_428;
  string local_3f8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_3d8;
  undefined1 local_378 [32];
  IVal *local_358;
  Precision PStack_350;
  undefined4 uStack_34c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_348;
  undefined4 local_340;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_2> local_1a8 [3];
  
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar9 = (this->m_caseCtx).numRandoms;
  local_4c0 = __return_storage_ptr__;
  iVar6 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_530 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_3d8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar3,(Precision)sVar9,(ulong)(iVar6 + 0xdeadbeef),
             in_stack_fffffffffffffab8);
  sVar9 = (long)local_3d8.in0.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_3d8.in0.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_428,sVar9);
  local_488.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_488.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_488.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_488.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_488.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_488.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_488.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_488.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_488._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_524 = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b8._M_impl.super__Rb_tree_header._M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4f0 = sVar9;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_540 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_448 = local_3d8.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_440 = local_3d8.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_438 = local_3d8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_430 = local_3d8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_458 = local_428.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_450 = local_428.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_540;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_378,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_520 + 8);
  local_520._8_4_ = _S_red;
  local_520._16_8_ = (_Base_ptr)0x0;
  local_4f8 = 0.0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_520._24_8_ = p_Var1;
  local_500 = p_Var1;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_520);
  for (p_Var7 = (_Rb_tree_node_base *)local_520._24_8_; p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    (**(code **)(**(long **)(p_Var7 + 1) + 0x30))(*(long **)(p_Var7 + 1),local_1a8);
  }
  if (local_4f8 != 0.0) {
    poVar2 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_540;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar2,(string *)&local_4e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_520);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  sVar9 = local_4f0;
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  ival = (IVal *)&local_458;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,local_4f0 & 0xffffffff,&local_448,ival,0);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_1a8);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_520);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_378);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_520);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_3f8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_378);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_541);
  lVar10 = 0;
  poVar2 = (ostringstream *)(local_378 + 8);
  local_4e8 = 0;
  local_538 = 0;
  while (bVar11 = sVar9 != 0, sVar9 = sVar9 - 1, bVar11) {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix(local_1a8);
    round<tcu::Vector<float,2>>
              ((IVal *)local_520,(shaderexecutor *)local_530,
               (FloatFormat *)
               ((long)(local_3d8.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),
               (Vector<float,_2> *)ival);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_378,local_530,(IVal *)local_520);
    pIVar8 = Environment::lookup<tcu::Vector<float,2>>
                       ((Environment *)&local_4b8,
                        (this->m_variables).in0.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                        .m_ptr);
    pIVar8->m_data[1].m_lo = (double)local_358;
    pIVar8->m_data[1].m_hi = (double)CONCAT44(uStack_34c,PStack_350);
    pIVar8->m_data[0].m_hi = (double)CONCAT44(local_378._20_4_,local_378._16_4_);
    *(ulong *)(pIVar8->m_data + 1) = CONCAT44(local_378._28_4_,local_378._24_4_);
    *(undefined8 *)pIVar8->m_data = local_378._0_8_;
    pIVar8->m_data[0].m_lo = (double)CONCAT44(local_378._12_4_,local_378._8_4_);
    round<tcu::Vector<float,2>>
              ((IVal *)local_520,(shaderexecutor *)local_530,
               (FloatFormat *)
               ((long)(local_3d8.in1.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),
               (Vector<float,_2> *)ival);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_378,local_530,(IVal *)local_520);
    pIVar8 = Environment::lookup<tcu::Vector<float,2>>
                       ((Environment *)&local_4b8,
                        (this->m_variables).in1.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                        .m_ptr);
    pIVar8->m_data[1].m_lo = (double)local_358;
    pIVar8->m_data[1].m_hi = (double)CONCAT44(uStack_34c,PStack_350);
    pIVar8->m_data[0].m_hi = (double)CONCAT44(local_378._20_4_,local_378._16_4_);
    *(ulong *)(pIVar8->m_data + 1) = CONCAT44(local_378._28_4_,local_378._24_4_);
    *(undefined8 *)pIVar8->m_data = local_378._0_8_;
    pIVar8->m_data[0].m_lo = (double)CONCAT44(local_378._12_4_,local_378._8_4_);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4b8,
               (this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4b8,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    PStack_350 = (this->m_caseCtx).precision;
    ival = (IVal *)local_530->m_maxValue;
    local_378._0_8_ = *(undefined8 *)local_530;
    local_378._8_4_ = local_530->m_fractionBits;
    local_378._12_4_ = local_530->m_hasSubnormal;
    local_378._16_4_ = local_530->m_hasInf;
    local_378._20_4_ = local_530->m_hasNaN;
    local_378[0x18] = local_530->m_exactPrecision;
    local_378._25_3_ = *(undefined3 *)&local_530->field_0x19;
    local_378._28_4_ = *(undefined4 *)&local_530->field_0x1c;
    local_340 = 0;
    pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_358 = ival;
    local_348 = &local_4b8;
    (*pSVar4->_vptr_Statement[3])(pSVar4,local_378);
    value = Environment::lookup<tcu::Matrix<float,2,2>>
                      ((Environment *)&local_4b8,
                       (this->m_variables).out0.
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                       .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_378,&local_488,value);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(local_1a8,(IVal *)local_378);
    bVar11 = ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::
             doContains(local_1a8,
                        (Matrix<float,_2,_2> *)
                        ((long)((local_428.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + local_4e8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_520);
    bVar11 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    if (!bVar11) {
      local_524 = (int)local_538 + 1;
      local_538 = (ulong)local_524;
      if ((int)local_524 < 0x65) {
        local_378._0_8_ = local_540;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Failed");
        std::operator<<((ostream *)poVar2," sample:\n");
        std::operator<<((ostream *)poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_520,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)poVar2,(string *)local_520);
        std::operator<<((ostream *)poVar2," = ");
        valueToString<tcu::Vector<float,2>>
                  (&local_4e0,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)(local_3d8.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),
                   (Vector<float,_2> *)ival);
        std::operator<<((ostream *)poVar2,(string *)&local_4e0);
        std::operator<<((ostream *)poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)local_520);
        std::operator<<((ostream *)poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_520,
                   (string *)
                   &((this->m_variables).in1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)poVar2,(string *)local_520);
        std::operator<<((ostream *)poVar2," = ");
        valueToString<tcu::Vector<float,2>>
                  (&local_4e0,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)(local_3d8.in1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),
                   (Vector<float,_2> *)ival);
        std::operator<<((ostream *)poVar2,(string *)&local_4e0);
        std::operator<<((ostream *)poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)local_520);
        std::operator<<((ostream *)poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_520,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)poVar2,(string *)local_520);
        std::operator<<((ostream *)poVar2," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_4e0,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)((local_428.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_4e8),(Matrix<float,_2,_2> *)ival);
        std::operator<<((ostream *)poVar2,(string *)&local_4e0);
        std::operator<<((ostream *)poVar2,"\n");
        std::operator<<((ostream *)poVar2,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_3f8,(shaderexecutor *)&local_488,(FloatFormat *)local_1a8,ival);
        std::operator<<((ostream *)poVar2,(string *)&local_3f8);
        std::operator<<((ostream *)poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)local_520);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
    }
    local_4e8 = local_4e8 + 0x10;
    lVar10 = lVar10 + 8;
  }
  if ((int)local_538 < 0x65) {
    if ((int)local_538 == 0) {
      poVar2 = (ostringstream *)(local_378 + 8);
      local_378._0_8_ = local_540;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<((ostream *)poVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_378,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_4c0;
      tcu::TestStatus::pass(local_4c0,(string *)local_378);
      this_02 = (string *)local_378;
      goto LAB_00825de2;
    }
  }
  else {
    poVar2 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_540;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"(Skipped ");
    std::ostream::operator<<(poVar2,(int)local_538 + -100);
    std::operator<<((ostream *)poVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  poVar2 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_540;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::operator<<(poVar2,(int)local_538);
  std::operator<<((ostream *)poVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<((ostream *)poVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  de::toString<int>((string *)local_1a8,(int *)&local_524);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_520," test failed. Check log for the details",
             (allocator<char> *)&local_4e0);
  __return_storage_ptr___00 = local_4c0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_520);
  this_02 = (string *)local_1a8;
LAB_00825de2:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4b8);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  ~Outputs(&local_428);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_3d8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}